

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O1

CURLcode Curl_ssl_scache_add_obj
                   (Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,void *sobj,
                   _func_void_void_ptr *sobj_free)

{
  curl_trc_feat *pcVar1;
  Curl_ssl_scache_peer *pCVar2;
  CURLcode CVar3;
  Curl_ssl_scache *scache;
  ssl_primary_config *conn_config;
  Curl_ssl_scache_peer *peer;
  Curl_ssl_scache_peer *local_38;
  
  scache = cf_ssl_scache_get(data);
  conn_config = Curl_ssl_cf_get_primary_config(cf);
  local_38 = (Curl_ssl_scache_peer *)0x0;
  if (scache == (Curl_ssl_scache *)0x0) {
    CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    CVar3 = cf_ssl_add_peer(data,scache,ssl_peer_key,conn_config,&local_38);
    pCVar2 = local_38;
    if (CVar3 == CURLE_OK && local_38 != (Curl_ssl_scache_peer *)0x0) {
      if (local_38->sobj_free != (_func_void_void_ptr *)0x0) {
        (*local_38->sobj_free)(local_38->sobj);
      }
      pCVar2->sobj = sobj;
      pCVar2->sobj_free = sobj_free;
      sobj = (void *)0x0;
      CVar3 = CURLE_OK;
    }
    else if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) && (0 < Curl_trc_feat_ssls.log_level)) {
      Curl_trc_ssls(data,"unable to add scache peer: %d",(ulong)CVar3);
    }
  }
  if (sobj_free != (_func_void_void_ptr *)0x0 && sobj != (void *)0x0) {
    (*sobj_free)(sobj);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_ssl_scache_add_obj(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 const char *ssl_peer_key,
                                 void *sobj,
                                 Curl_ssl_scache_obj_dtor *sobj_free)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  CURLcode result;

  DEBUGASSERT(sobj);
  DEBUGASSERT(sobj_free);

  if(!scache) {
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto out;
  }

  result = cf_ssl_add_peer(data, scache, ssl_peer_key, conn_config, &peer);
  if(result || !peer) {
    CURL_TRC_SSLS(data, "unable to add scache peer: %d", result);
    goto out;
  }

  cf_ssl_scache_peer_set_obj(peer, sobj, sobj_free);
  sobj = NULL;  /* peer took ownership */

out:
  if(sobj && sobj_free)
    sobj_free(sobj);
  return result;
}